

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.h
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::ClassId(TPZCompElHDiv<pzshape::TPZShapeQuad> *this)

{
  uint uVar1;
  int iVar2;
  TPZIntelGen<pzshape::TPZShapeQuad> *unaff_retaddr;
  string *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = Hash(in_stack_ffffffffffffffc0);
  iVar2 = TPZIntelGen<pzshape::TPZShapeQuad>::ClassId(unaff_retaddr);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1 ^ iVar2 << 1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::ClassId() const{
    return Hash("TPZCompElHDiv") ^ TPZIntelGen<TSHAPE>::ClassId() << 1;
}